

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

HRESULT __thiscall
Diligent::anon_unknown_0::DxcIncludeHandlerImpl::LoadSource
          (DxcIncludeHandlerImpl *this,LPCWSTR pFilename,IDxcBlob **ppIncludeSource)

{
  char cVar1;
  IDxcLibrary *pIVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  Char *pCVar7;
  HRESULT HVar8;
  char (*Args_2) [2];
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  RefCntAutoPtr<Diligent::DataBlobImpl> pFileData;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  String fileName;
  string _msg;
  long *local_88;
  undefined1 local_80 [48];
  string local_50;
  
  HVar8 = -0x7ff8ffa9;
  if (ppIncludeSource != (IDxcBlob **)0x0 && pFilename != (LPCWSTR)0x0) {
    *ppIncludeSource = (IDxcBlob *)0x0;
    local_80._24_8_ = (Char *)0x0;
    local_80[0x20] = 0;
    local_80._16_8_ = (IMemoryAllocator *)(local_80 + 0x20);
    sVar4 = wcslen(pFilename);
    std::__cxx11::string::resize((ulong)(local_80 + 0x10),(char)sVar4);
    if ((Char *)local_80._24_8_ != (Char *)0x0) {
      pCVar7 = (Char *)0x0;
      do {
        *(Char *)((long)(_func_int ***)local_80._16_8_ + (long)pCVar7) =
             (Char)pFilename[(long)pCVar7];
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 < (ulong)local_80._24_8_);
    }
    if ((Char *)local_80._24_8_ == (Char *)0x0) {
      HVar8 = -0x7fffbffb;
      LogError<false,char[44],std::__cxx11::string,char[32]>
                (false,"LoadSource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                 ,200,(char (*) [44])"Failed to convert shader include file name ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_80 + 0x10),(char (*) [32])". File name must be ANSI string");
    }
    else {
      if ((((Char *)0x2 < (ulong)local_80._24_8_) &&
          (*(char *)(_func_int ***)local_80._16_8_ == '.')) &&
         ((cVar1 = *(char *)((long)(_func_int ***)local_80._16_8_ + 1), cVar1 == '\\' ||
          (cVar1 == '/')))) {
        std::__cxx11::string::erase((ulong)(local_80 + 0x10),0);
      }
      local_50._M_string_length = (size_type)(local_80 + 8);
      local_80._8_8_ = (RefCountersImpl *)0x0;
      local_50._M_dataplus._M_p = (pointer)0x0;
      (*(this->m_pStreamFactory->super_IObject)._vptr_IObject[4])();
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)(local_80 + 0x30));
      if ((RefCountersImpl *)local_80._8_8_ == (RefCountersImpl *)0x0) {
        HVar8 = -0x7fffbffb;
        LogError<false,char[36],std::__cxx11::string,char[29]>
                  (false,"LoadSource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                   ,0xd4,(char (*) [36])"Failed to open shader include file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_80 + 0x10),(char (*) [29])0x83fa4f);
      }
      else {
        DataBlobImpl::Create((DataBlobImpl *)local_80,0,(void *)0x0);
        (*((IReferenceCounters *)local_80._8_8_)->_vptr_IReferenceCounters[5])();
        local_88 = (long *)0x0;
        pIVar2 = (this->m_pdxcLibrary).super_CComPtrBase<IDxcLibrary>.p;
        pvVar5 = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_80._0_8_,0);
        sVar6 = DataBlobImpl::GetSize((DataBlobImpl *)local_80._0_8_);
        if (local_88 != (long *)0x0) {
          __assert_fail("p == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/../../ThirdParty/DirectXShaderCompiler/dxc/WinAdapter.h"
                        ,0x29d,
                        "T **CComPtrBase<IDxcBlobEncoding>::operator&() [T = IDxcBlobEncoding]");
        }
        Args_2 = (char (*) [2])&local_88;
        iVar3 = (**(code **)(*(long *)pIVar2 + 0x30))(pIVar2,pvVar5,sVar6 & 0xffffffff,0xfde9);
        if (iVar3 < 0) {
          FormatString<char[50],std::__cxx11::string,char[2]>
                    ((string *)(local_80 + 0x30),
                     (Diligent *)"Failed to allocate space for shader include file ",
                     (char (*) [50])(local_80 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x91f766,
                     Args_2);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_50._M_dataplus._M_p,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,
                            (ulong)(local_50.field_2._M_allocated_capacity + 1));
          }
          HVar8 = -0x7fffbffb;
        }
        else {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
          ::emplace_back<Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
                      *)&this->m_FileDataCache,(RefCntAutoPtr<Diligent::DataBlobImpl> *)local_80);
          HVar8 = 0;
          (**(code **)*local_88)
                    (local_88,_GUID_8ba5fb08_5195_40e2_ac58_0d989c3a0102,ppIncludeSource);
        }
        if (local_88 != (long *)0x0) {
          (**(code **)(*local_88 + 0x10))();
          local_88 = (long *)0x0;
        }
        RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                  ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_80);
      }
      if ((RefCountersImpl *)local_80._8_8_ != (RefCountersImpl *)0x0) {
        (*((IReferenceCounters *)local_80._8_8_)->_vptr_IReferenceCounters[2])();
        local_80._8_8_ = (RefCountersImpl *)0x0;
      }
    }
    if ((IMemoryAllocator *)local_80._16_8_ != (IMemoryAllocator *)(local_80 + 0x20)) {
      operator_delete((void *)local_80._16_8_,CONCAT71(local_80._33_7_,local_80[0x20]) + 1);
    }
  }
  return HVar8;
}

Assistant:

LoadSource(_In_ LPCWSTR pFilename, _COM_Outptr_result_maybenull_ IDxcBlob** ppIncludeSource) override
    {
        if (pFilename == nullptr)
            return E_INVALIDARG;


        if (ppIncludeSource == nullptr)
            return E_INVALIDARG;

        *ppIncludeSource = nullptr;

        String fileName;
        fileName.resize(wcslen(pFilename));
        for (size_t i = 0; i < fileName.size(); ++i)
        {
            fileName[i] = static_cast<char>(pFilename[i]);
        }

        if (fileName.empty())
        {
            LOG_ERROR("Failed to convert shader include file name ", fileName, ". File name must be ANSI string");
            return E_FAIL;
        }

        // validate file name
        if (fileName.size() > 2 && fileName[0] == '.' && (fileName[1] == '\\' || fileName[1] == '/'))
            fileName.erase(0, 2);

        RefCntAutoPtr<IFileStream> pSourceStream;
        m_pStreamFactory->CreateInputStream(fileName.c_str(), &pSourceStream);
        if (pSourceStream == nullptr)
        {
            LOG_ERROR("Failed to open shader include file ", fileName, ". Check that the file exists");
            return E_FAIL;
        }

        RefCntAutoPtr<DataBlobImpl> pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);

        CComPtr<IDxcBlobEncoding> pSourceBlob;

        HRESULT hr = m_pdxcLibrary->CreateBlobWithEncodingFromPinned(pFileData->GetDataPtr(), static_cast<UINT32>(pFileData->GetSize()), CP_UTF8, &pSourceBlob);
        if (FAILED(hr))
        {
            LOG_ERROR_MESSAGE("Failed to allocate space for shader include file ", fileName, ".");
            return E_FAIL;
        }

        m_FileDataCache.emplace_back(std::move(pFileData));

        pSourceBlob->QueryInterface(IID_PPV_ARGS(ppIncludeSource));
        return S_OK;
    }